

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O3

void __thiscall
MetadataTest_GetMetadataFromImage_Test::TestBody(MetadataTest_GetMetadataFromImage_Test *this)

{
  undefined8 *puVar1;
  int iVar2;
  pointer *__ptr;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  SEARCH_METHODS *pSVar4;
  aom_metadata_t *metadata;
  aom_image_t image;
  AssertHelper local_d8;
  AssertHelper local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  internal local_c0 [8];
  undefined8 *local_b8;
  aom_image_t local_b0;
  
  local_b0.metadata = (aom_metadata_array_t *)0x0;
  local_c8._M_head_impl._0_4_ =
       aom_img_add_metadata
                 (&local_b0,4,(anonymous_namespace)::kMetadataPayloadT35,0x18,AOM_MIF_ANY_FRAME);
  local_d8.data_ = (AssertHelperData *)((ulong)local_d8.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            (local_c0,
             "aom_img_add_metadata(&image, OBU_METADATA_TYPE_ITUT_T35, kMetadataPayloadT35, kMetadataPayloadSizeT35, AOM_MIF_ANY_FRAME)"
             ,"0",(int *)&local_c8,(int *)&local_d8);
  puVar1 = local_b8;
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b8 == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = (SEARCH_METHODS *)*local_b8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
               ,0x208,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c8);
  }
  else {
    if (local_b8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_b8 != local_b8 + 2) {
        operator_delete((undefined8 *)*local_b8);
      }
      operator_delete(puVar1);
    }
    iVar2 = aom_img_add_metadata
                      (&local_b0,4,(anonymous_namespace)::kMetadataPayloadT35,0x18,
                       AOM_MIF_ANY_FRAME_LAYER_SPECIFIC);
    local_c8._M_head_impl._0_4_ = iVar2;
    local_d8.data_ = local_d8.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,int>
              (local_c0,
               "aom_img_add_metadata(&image, OBU_METADATA_TYPE_ITUT_T35, kMetadataPayloadT35, kMetadataPayloadSizeT35, AOM_MIF_ANY_FRAME_LAYER_SPECIFIC)"
               ,"0",(int *)&local_c8,(int *)&local_d8);
    puVar1 = local_b8;
    if (local_c0[0] != (internal)0x0) {
      if (local_b8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_b8 != local_b8 + 2) {
          operator_delete((undefined8 *)*local_b8);
        }
        operator_delete(puVar1);
      }
      local_c8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           aom_img_get_metadata((aom_image_t *)0x0,0);
      local_d8.data_ = (AssertHelperData *)0x0;
      testing::internal::CmpHelperEQ<aom_metadata_const*,decltype(nullptr)>
                (local_c0,"aom_img_get_metadata(nullptr, 0)","nullptr",(aom_metadata **)&local_c8,
                 &local_d8.data_);
      if (local_c0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_c8);
        if (local_b8 == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = (SEARCH_METHODS *)*local_b8;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
                   ,0x20e,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_d8);
        if ((aom_metadata_t *)local_c8._M_head_impl != (aom_metadata_t *)0x0) {
          (**(code **)(*(long *)local_c8._M_head_impl + 8))();
        }
      }
      puVar1 = local_b8;
      if (local_b8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_b8 != local_b8 + 2) {
          operator_delete((undefined8 *)*local_b8);
        }
        operator_delete(puVar1);
      }
      local_c8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           aom_img_get_metadata(&local_b0,2);
      local_d8.data_ = (AssertHelperData *)0x0;
      testing::internal::CmpHelperEQ<aom_metadata_const*,decltype(nullptr)>
                (local_c0,"aom_img_get_metadata(&image, 2u)","nullptr",(aom_metadata **)&local_c8,
                 &local_d8.data_);
      if (local_c0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_c8);
        if (local_b8 == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = (SEARCH_METHODS *)*local_b8;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
                   ,0x20f,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_d8);
        if ((aom_metadata_t *)local_c8._M_head_impl != (aom_metadata_t *)0x0) {
          (**(code **)(*(long *)local_c8._M_head_impl + 8))();
        }
      }
      puVar1 = local_b8;
      if (local_b8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_b8 != local_b8 + 2) {
          operator_delete((undefined8 *)*local_b8);
        }
        operator_delete(puVar1);
      }
      local_c8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           aom_img_get_metadata(&local_b0,10);
      local_d8.data_ = (AssertHelperData *)0x0;
      testing::internal::CmpHelperEQ<aom_metadata_const*,decltype(nullptr)>
                (local_c0,"aom_img_get_metadata(&image, 10u)","nullptr",(aom_metadata **)&local_c8,
                 &local_d8.data_);
      if (local_c0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_c8);
        if (local_b8 == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = (SEARCH_METHODS *)*local_b8;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
                   ,0x210,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_d8);
        if ((aom_metadata_t *)local_c8._M_head_impl != (aom_metadata_t *)0x0) {
          (**(code **)(*(long *)local_c8._M_head_impl + 8))();
        }
      }
      puVar1 = local_b8;
      if (local_b8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_b8 != local_b8 + 2) {
          operator_delete((undefined8 *)*local_b8);
        }
        operator_delete(puVar1);
      }
      local_c8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           aom_img_get_metadata(&local_b0,0);
      local_d8.data_ = (AssertHelperData *)0x0;
      testing::internal::CmpHelperNE<aom_metadata_const*,decltype(nullptr)>
                (local_c0,"metadata","nullptr",(aom_metadata **)&local_c8,&local_d8.data_);
      puVar1 = local_b8;
      if (local_c0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_d8);
        if (local_b8 == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = (SEARCH_METHODS *)*local_b8;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
                   ,0x213,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      }
      else {
        if (local_b8 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_b8 != local_b8 + 2) {
            operator_delete((undefined8 *)*local_b8);
          }
          operator_delete(puVar1);
        }
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  (local_c0,"metadata->sz","kMetadataPayloadSizeT35",
                   (unsigned_long *)(local_c8._M_head_impl + 0x10),
                   &(anonymous_namespace)::kMetadataPayloadSizeT35);
        puVar1 = local_b8;
        if (local_c0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_d8);
          if (local_b8 == (undefined8 *)0x0) {
            pSVar4 = "";
          }
          else {
            pSVar4 = (SEARCH_METHODS *)*local_b8;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
                     ,0x214,(char *)pSVar4);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
        }
        else {
          if (local_b8 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_b8 != local_b8 + 2) {
              operator_delete((undefined8 *)*local_b8);
            }
            operator_delete(puVar1);
          }
          iVar2 = memcmp((anonymous_namespace)::kMetadataPayloadT35,
                         *(uint8_t **)(local_c8._M_head_impl + 8),0x18);
          local_d8.data_._0_4_ = iVar2;
          local_d0.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<int,int>
                    (local_c0,
                     "memcmp(kMetadataPayloadT35, metadata->payload, kMetadataPayloadSizeT35)","0",
                     (int *)&local_d8,(int *)&local_d0);
          if (local_c0[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_d8);
            if (local_b8 == (undefined8 *)0x0) {
              pSVar4 = "";
            }
            else {
              pSVar4 = (SEARCH_METHODS *)*local_b8;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_d0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
                       ,0x217,(char *)pSVar4);
            testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
            testing::internal::AssertHelper::~AssertHelper(&local_d0);
            if (local_d8.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_d8.data_ + 8))();
            }
          }
          puVar1 = local_b8;
          if (local_b8 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_b8 != local_b8 + 2) {
              operator_delete((undefined8 *)*local_b8);
            }
            operator_delete(puVar1);
          }
          local_d8.data_._0_4_ = 2;
          testing::internal::CmpHelperEQ<aom_metadata_insert_flags,aom_metadata_insert_flags>
                    (local_c0,"metadata->insert_flag","AOM_MIF_ANY_FRAME",
                     (aom_metadata_insert_flags *)(local_c8._M_head_impl + 0x18),
                     (aom_metadata_insert_flags *)&local_d8);
          if (local_c0[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_d8);
            if (local_b8 == (undefined8 *)0x0) {
              pSVar4 = "";
            }
            else {
              pSVar4 = (SEARCH_METHODS *)*local_b8;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_d0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
                       ,0x218,(char *)pSVar4);
            testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
            testing::internal::AssertHelper::~AssertHelper(&local_d0);
            if (local_d8.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_d8.data_ + 8))();
            }
          }
          puVar1 = local_b8;
          if (local_b8 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_b8 != local_b8 + 2) {
              operator_delete((undefined8 *)*local_b8);
            }
            operator_delete(puVar1);
          }
          local_c8._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               aom_img_get_metadata(&local_b0,1);
          local_d8.data_ = (AssertHelperData *)0x0;
          testing::internal::CmpHelperNE<aom_metadata_const*,decltype(nullptr)>
                    (local_c0,"metadata","nullptr",(aom_metadata **)&local_c8,&local_d8.data_);
          puVar1 = local_b8;
          if (local_c0[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_d8);
            if (local_b8 == (undefined8 *)0x0) {
              pSVar4 = "";
            }
            else {
              pSVar4 = (SEARCH_METHODS *)*local_b8;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
                       ,0x21b,(char *)pSVar4);
            testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
          }
          else {
            if (local_b8 != (undefined8 *)0x0) {
              if ((undefined8 *)*local_b8 != local_b8 + 2) {
                operator_delete((undefined8 *)*local_b8);
              }
              operator_delete(puVar1);
            }
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      (local_c0,"metadata->sz","kMetadataPayloadSizeT35",
                       (unsigned_long *)(local_c8._M_head_impl + 0x10),
                       &(anonymous_namespace)::kMetadataPayloadSizeT35);
            puVar1 = local_b8;
            if (local_c0[0] != (internal)0x0) {
              if (local_b8 != (undefined8 *)0x0) {
                if ((undefined8 *)*local_b8 != local_b8 + 2) {
                  operator_delete((undefined8 *)*local_b8);
                }
                operator_delete(puVar1);
              }
              iVar2 = memcmp((anonymous_namespace)::kMetadataPayloadT35,
                             *(uint8_t **)(local_c8._M_head_impl + 8),0x18);
              local_d8.data_._0_4_ = iVar2;
              local_d0.data_._0_4_ = 0;
              testing::internal::CmpHelperEQ<int,int>
                        (local_c0,
                         "memcmp(kMetadataPayloadT35, metadata->payload, kMetadataPayloadSizeT35)",
                         "0",(int *)&local_d8,(int *)&local_d0);
              if (local_c0[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_d8);
                if (local_b8 == (undefined8 *)0x0) {
                  pSVar4 = "";
                }
                else {
                  pSVar4 = (SEARCH_METHODS *)*local_b8;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_d0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
                           ,0x21f,(char *)pSVar4);
                testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
                testing::internal::AssertHelper::~AssertHelper(&local_d0);
                if (local_d8.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_d8.data_ + 8))();
                }
              }
              puVar1 = local_b8;
              if (local_b8 != (undefined8 *)0x0) {
                if ((undefined8 *)*local_b8 != local_b8 + 2) {
                  operator_delete((undefined8 *)*local_b8);
                }
                operator_delete(puVar1);
              }
              local_d8.data_._0_4_ = 0x12;
              testing::internal::CmpHelperEQ<aom_metadata_insert_flags,aom_metadata_insert_flags>
                        (local_c0,"metadata->insert_flag","AOM_MIF_ANY_FRAME_LAYER_SPECIFIC",
                         (aom_metadata_insert_flags *)(local_c8._M_head_impl + 0x18),
                         (aom_metadata_insert_flags *)&local_d8);
              if (local_c0[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_d8);
                if (local_b8 == (undefined8 *)0x0) {
                  pSVar4 = "";
                }
                else {
                  pSVar4 = (SEARCH_METHODS *)*local_b8;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_d0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
                           ,0x220,(char *)pSVar4);
                testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
                testing::internal::AssertHelper::~AssertHelper(&local_d0);
                if (local_d8.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_d8.data_ + 8))();
                }
              }
              if (local_b8 != (undefined8 *)0x0) {
                if ((undefined8 *)*local_b8 != local_b8 + 2) {
                  operator_delete((undefined8 *)*local_b8);
                }
                operator_delete(local_b8);
              }
              aom_img_metadata_array_free(local_b0.metadata);
              return;
            }
            testing::Message::Message((Message *)&local_d8);
            if (local_b8 == (undefined8 *)0x0) {
              pSVar4 = "";
            }
            else {
              pSVar4 = (SEARCH_METHODS *)*local_b8;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
                       ,0x21c,(char *)pSVar4);
            testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
          }
        }
      }
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      _Var3._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8.data_
      ;
      goto LAB_00759a73;
    }
    testing::Message::Message((Message *)&local_c8);
    if (local_b8 == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = (SEARCH_METHODS *)*local_b8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
               ,0x20c,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c8);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_d8);
  _Var3._M_head_impl = local_c8._M_head_impl;
LAB_00759a73:
  if ((AssertHelperData *)_Var3._M_head_impl != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)_Var3._M_head_impl + 8))();
  }
  if (local_b8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_b8 != local_b8 + 2) {
      operator_delete((undefined8 *)*local_b8);
    }
    operator_delete(local_b8);
  }
  return;
}

Assistant:

TEST(MetadataTest, GetMetadataFromImage) {
  aom_image_t image;
  image.metadata = nullptr;

  ASSERT_EQ(aom_img_add_metadata(&image, OBU_METADATA_TYPE_ITUT_T35,
                                 kMetadataPayloadT35, kMetadataPayloadSizeT35,
                                 AOM_MIF_ANY_FRAME),
            0);
  ASSERT_EQ(aom_img_add_metadata(&image, OBU_METADATA_TYPE_ITUT_T35,
                                 kMetadataPayloadT35, kMetadataPayloadSizeT35,
                                 AOM_MIF_ANY_FRAME_LAYER_SPECIFIC),
            0);

  EXPECT_EQ(aom_img_get_metadata(nullptr, 0), nullptr);
  EXPECT_EQ(aom_img_get_metadata(&image, 2u), nullptr);
  EXPECT_EQ(aom_img_get_metadata(&image, 10u), nullptr);

  const aom_metadata_t *metadata = aom_img_get_metadata(&image, 0);
  ASSERT_NE(metadata, nullptr);
  ASSERT_EQ(metadata->sz, kMetadataPayloadSizeT35);
  EXPECT_EQ(
      memcmp(kMetadataPayloadT35, metadata->payload, kMetadataPayloadSizeT35),
      0);
  EXPECT_EQ(metadata->insert_flag, AOM_MIF_ANY_FRAME);

  metadata = aom_img_get_metadata(&image, 1);
  ASSERT_NE(metadata, nullptr);
  ASSERT_EQ(metadata->sz, kMetadataPayloadSizeT35);
  EXPECT_EQ(
      memcmp(kMetadataPayloadT35, metadata->payload, kMetadataPayloadSizeT35),
      0);
  EXPECT_EQ(metadata->insert_flag, AOM_MIF_ANY_FRAME_LAYER_SPECIFIC);

  aom_img_metadata_array_free(image.metadata);
}